

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<unsigned_int>(uint length)

{
  undefined4 *puVar1;
  long lVar2;
  ulong uVar3;
  shared_ptr<unsigned_int> pv;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = (long)(int)length * 4;
  }
  puVar1 = (undefined4 *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,puVar1,
             nosimd::common::free<unsigned_int>);
  if (0 < (int)length) {
    lVar2 = 0;
    do {
      *puVar1 = (int)lVar2;
      lVar2 = lVar2 + -1;
      puVar1 = puVar1 + 1;
    } while (-lVar2 != (ulong)length);
  }
  if (pv.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}